

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_VarIsJust(Cbs2_Man_t *p,Gia_Obj_t *pVar,int iVar)

{
  int iVar1;
  undefined1 local_1d;
  int iVar_local;
  Gia_Obj_t *pVar_local;
  Cbs2_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pVar);
  local_1d = 0;
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninId0(pVar,iVar);
    iVar1 = Cbs2_VarIsAssigned(p,iVar1);
    local_1d = 0;
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId1(pVar,iVar);
      iVar1 = Cbs2_VarIsAssigned(p,iVar1);
      local_1d = iVar1 != 0 ^ 0xff;
    }
  }
  return (int)(local_1d & 1);
}

Assistant:

static inline int   Cbs2_VarIsJust( Cbs2_Man_t * p, Gia_Obj_t * pVar, int iVar )      { return Gia_ObjIsAnd(pVar) && !Cbs2_VarIsAssigned(p, Gia_ObjFaninId0(pVar, iVar)) && !Cbs2_VarIsAssigned(p, Gia_ObjFaninId1(pVar, iVar));  }